

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O2

void integralEquationIteration<long_double>
               (QuickselectParams<long_double> *quickselectParams,
               vector<long_double,_std::allocator<long_double>_> *fOld,
               vector<long_double,_std::allocator<long_double>_> *fNewOut)

{
  long lVar1;
  uint uVar2;
  uint b;
  uint uVar3;
  uint b_00;
  uint uVar4;
  long lVar5;
  long lVar6;
  pointer plVar7;
  pointer plVar8;
  pointer plVar9;
  pointer plVar10;
  int j;
  int iVar11;
  int iVar12;
  long lVar13;
  int l;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  longdouble in_ST0;
  longdouble lVar17;
  longdouble in_ST1;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble lVar21;
  longdouble lVar22;
  longdouble lVar23;
  longdouble lVar24;
  longdouble lVar25;
  longdouble lVar26;
  longdouble in_ST2;
  longdouble lVar27;
  longdouble lVar28;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar29;
  longdouble in_ST5;
  longdouble lVar30;
  double dVar31;
  longdouble local_224;
  longdouble local_218;
  longdouble local_190;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  lVar5 = (long)(fNewOut->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(fNewOut->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  plVar7 = (pointer)(lVar5 >> 4);
  lVar16 = (long)(fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  lVar17 = (longdouble)lVar16;
  lVar1 = lVar16 + -1;
  plVar10 = (pointer)0x0;
  plVar9 = plVar7;
  plVar8 = plVar7;
  if ((long)plVar7 < 1) {
    plVar9 = plVar10;
    plVar8 = plVar10;
  }
  for (; plVar10 != plVar8; plVar10 = (pointer)((long)plVar10 + 1)) {
    lVar18 = (longdouble)((long)plVar10 * 2 + 1) / (longdouble)(lVar5 >> 3);
    (*quickselectParams->_vptr_QuickselectParams[1])(&t,quickselectParams);
    uVar15 = (long)t.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)t.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    (**quickselectParams->_vptr_QuickselectParams)(quickselectParams);
    uVar3 = *t.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&t);
    uVar2 = tRight((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,1);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    lVar19 = (longdouble)(1.0 / (double)(long)plVar7) * ((longdouble)1 - lVar18);
    uVar14 = (ulong)(uVar2 + 1);
    lVar28 = in_ST5;
    beta<long_double>(uVar2 + 1,b);
    lVar27 = ((longdouble)1 - lVar18) / lVar19;
    lVar20 = lVar18 + lVar19 * (longdouble)0.5;
    lVar22 = (longdouble)0;
    for (iVar11 = 0; (longdouble)iVar11 < lVar27; iVar11 = iVar11 + 1) {
      lVar21 = lVar20 + lVar19 * (longdouble)iVar11;
      lVar29 = lVar28;
      lVar23 = lVar28;
      dVar31 = floor((double)(lVar17 * (lVar18 / lVar21)));
      lVar13 = (long)dVar31;
      if (lVar16 <= (long)dVar31) {
        lVar13 = lVar1;
      }
      plVar9 = (fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar25 = plVar9[lVar13];
      pow<long_double>((longdouble *)(ulong)(uVar3 + 1),lVar21,(uint)uVar14);
      pow<long_double>((longdouble *)(ulong)uVar2,(longdouble)1 - lVar21,(uint)uVar14);
      lVar22 = lVar22 + in_ST2 * lVar25 * in_ST3;
      in_ST2 = in_ST4;
      in_ST3 = in_ST5;
      in_ST4 = lVar28;
      in_ST5 = lVar29;
      lVar28 = lVar23;
    }
    iVar11 = *(int *)((long)t.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                     ((long)(uVar15 * 0x40000000 + -0x100000000) >> 0x1e));
    lVar29 = lVar28;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,&t);
    l = (int)(uVar15 >> 2);
    uVar3 = tLeft((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,l);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
    lVar23 = lVar18 * (longdouble)(1.0 / (double)(long)plVar7);
    uVar14 = (ulong)(uVar3 + 1);
    beta<long_double>(uVar3 + 1,b_00);
    local_224 = (longdouble)0;
    lVar21 = lVar23 * (longdouble)0.5 + local_224;
    for (iVar12 = 0; (longdouble)iVar12 < lVar18 / lVar23; iVar12 = iVar12 + 1) {
      lVar24 = lVar21 + lVar23 * (longdouble)iVar12;
      lVar25 = lVar28;
      lVar26 = lVar28;
      lVar29 = lVar28;
      dVar31 = floor((double)(lVar17 * ((lVar18 - lVar24) / ((longdouble)1 - lVar24))));
      lVar13 = (long)dVar31;
      if (lVar16 <= (long)dVar31) {
        lVar13 = lVar1;
      }
      plVar9 = (fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar30 = plVar9[lVar13];
      pow<long_double>((longdouble *)(ulong)(iVar11 + 1),(longdouble)1 - lVar24,(uint)uVar14);
      pow<long_double>((longdouble *)(ulong)uVar3,lVar24,(uint)uVar14);
      local_224 = local_224 + in_ST3 * lVar30 * in_ST4;
      in_ST3 = in_ST5;
      in_ST4 = lVar28;
      in_ST5 = lVar25;
      lVar28 = lVar26;
    }
    local_190 = in_ST0 + (lVar19 / in_ST1) * lVar22 + local_224 * (lVar23 / in_ST2);
    lVar13 = 2;
    in_ST0 = in_ST3;
    in_ST1 = in_ST4;
    in_ST2 = in_ST5;
    in_ST3 = lVar28;
    in_ST4 = lVar29;
    in_ST5 = lVar29;
    while( true ) {
      if (l <= lVar13) break;
      lVar22 = in_ST5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &t.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      uVar2 = tLeft((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,(int)lVar13);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
      uVar3 = t.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13 + -1];
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &t.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      uVar4 = tRight((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,(int)lVar13);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
      uVar3 = uVar3 + 1;
      uVar14 = (ulong)uVar3;
      beta<long_double>((longdouble *)(ulong)(uVar2 + 1),uVar3,uVar4 + 1,(uint)plVar9);
      local_218 = (longdouble)0;
      for (iVar11 = 0; (longdouble)iVar11 < lVar18 / lVar23; iVar11 = iVar11 + 1) {
        lVar22 = lVar21 + lVar23 * (longdouble)iVar11;
        for (iVar12 = 0; (longdouble)iVar12 < lVar27; iVar12 = iVar12 + 1) {
          lVar25 = lVar20 + lVar19 * (longdouble)iVar12;
          lVar26 = lVar25 - lVar22;
          lVar28 = in_ST5;
          lVar29 = in_ST5;
          dVar31 = floor((double)(lVar17 * ((lVar18 - lVar22) / lVar26)));
          lVar6 = (long)dVar31;
          if (lVar16 <= (long)dVar31) {
            lVar6 = lVar1;
          }
          plVar9 = (fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar24 = plVar9[lVar6];
          lVar30 = lVar29;
          pow<long_double>((longdouble *)(ulong)uVar2,lVar22,(uint)uVar14);
          pow<long_double>((longdouble *)(ulong)uVar3,lVar26,(uint)uVar14);
          pow<long_double>((longdouble *)(ulong)uVar4,(longdouble)1 - lVar25,(uint)uVar14);
          local_218 = local_218 + in_ST2 * in_ST1 * lVar24 * in_ST3;
          in_ST1 = in_ST4;
          in_ST2 = in_ST5;
          in_ST3 = lVar28;
          in_ST4 = lVar29;
          in_ST5 = lVar30;
        }
        lVar22 = in_ST5;
      }
      local_190 = local_190 + local_218 * ((lVar23 * lVar19) / in_ST0);
      lVar13 = lVar13 + 1;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar22;
    }
    plVar9 = (pointer)((long)plVar10 * 0x10);
    (fNewOut->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
    super__Vector_impl_data._M_start[(long)plVar10] = local_190;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&t.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return;
}

Assistant:

void integralEquationIteration(const QuickselectParams<Num> * quickselectParams,
                               const vector<Num> & fOld, vector<Num> & fNewOut) {
	const long L = fNewOut.size();
	const long LOld = fOld.size();
	const Num Delta = 1.0 / L;

	for (int i = 0; i < L; ++i) {
		auto alpha = alphaForIndex<Num>(i, L);
		const vector<unsigned int> t = quickselectParams->samplingParameter(alpha);
		auto s = static_cast<int>(t.size());

		// partitioning costs
		Num newValue = quickselectParams->partitioningCosts(alpha);
		// first integral (left call)
		{
			const unsigned int t1 = t[0], t2 = tRight(t, 1) ;
			Num step = Delta * (1 - alpha);
			const Num commonFactor = step / beta<Num>(t1 + 1, t2 + 1);
			Num sum = 0;
			for (int j = 0; j < (1-alpha) / step; ++j) {
				Num u = alpha + step/2 + j*step;
//			}
//			for (Num u = alpha + step / 2; u < 1; u += step) {
				Num summand = fOld[indexForAlpha(alpha / u, LOld)]
				              * pow(u,t1+1) * pow(1-u,t2);
				sum += summand;
			}
			newValue += sum * commonFactor;
		}
		// second integral (right call)
		{
			const unsigned int t1 = t[s-1], t2 = tLeft(t, s) ;
			Num step = Delta * alpha;
			const Num commonFactor = step / beta<Num>(t1 + 1, t2 + 1);
			Num sum = 0;
			for (int j = 0; j < alpha / step; ++j) {
				Num v = 0 + step/2 + j*step;
//			for (Num v = 0 + step / 2; v < alpha; v += step) {
				Num summand = fOld[indexForAlpha((alpha-v) / (1-v), LOld)]
				              * pow(1-v,t1+1) * pow(v,t2);
				sum += summand;
			}
			newValue += sum * commonFactor;
		}
		// third integrals (middle calls)
		for (int l = 2; l <= s-1; ++l) {
			const unsigned int t1 = tLeft(t,l), t2 = t[l-1], t3 = tRight(t,l) ;
			Num step1 = Delta * alpha, step2 = Delta * (1-alpha);
			const Num commonFactor = step1 * step2 / beta<Num>(t1 + 1, t2 + 1, t3 + 1);
			Num sum = 0;
			for (int j1 = 0; j1 < alpha / step1; ++j1) {
				for (int j2 = 0; j2 < (1 - alpha) / step2; ++j2) {
					Num u = 0 + step1 / 2 + j1 * step1;
					Num v = alpha + step2 / 2 + j2 * step2;
					Num summand = fOld[indexForAlpha((alpha - u) / (v - u), LOld)]
					              * pow(u,t1) * pow(v - u, t2 + 1) * pow(1-v, t3) ;
					sum += summand;
				}
			}
			newValue += sum * commonFactor;
		}

		fNewOut[i] = newValue;
	}

}